

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

UBool __thiscall
icu_63::UnicodeString::endsWith
          (UnicodeString *this,UnicodeString *srcText,int32_t srcStart,int32_t srcLength)

{
  int8_t iVar1;
  int32_t iVar2;
  int32_t local_20;
  int32_t local_1c;
  int32_t srcLength_local;
  int32_t srcStart_local;
  UnicodeString *srcText_local;
  UnicodeString *this_local;
  
  local_20 = srcLength;
  local_1c = srcStart;
  _srcLength_local = srcText;
  srcText_local = this;
  pinIndices(srcText,&local_1c,&local_20);
  iVar2 = length(this);
  iVar1 = doCompare(this,iVar2 - local_20,local_20,_srcLength_local,local_1c,local_20);
  return iVar1 == '\0';
}

Assistant:

inline UBool
UnicodeString::endsWith(const UnicodeString& srcText,
            int32_t srcStart,
            int32_t srcLength) const {
  srcText.pinIndices(srcStart, srcLength);
  return doCompare(length() - srcLength, srcLength,
                   srcText, srcStart, srcLength) == 0;
}